

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O1

real __thiscall fasttext::Vector::norm(Vector *this)

{
  pointer pfVar1;
  long lVar2;
  long lVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  pfVar1 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar1 >> 2;
  auVar5 = ZEXT816(0) << 0x40;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      auVar6 = ZEXT416((uint)pfVar1[lVar3]);
      auVar5 = vfmadd231ss_fma(auVar5,auVar6,auVar6);
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  if (0.0 <= auVar5._0_4_) {
    auVar5 = vsqrtss_avx(auVar5,auVar5);
    return auVar5._0_4_;
  }
  fVar4 = sqrtf(auVar5._0_4_);
  return fVar4;
}

Assistant:

real Vector::norm() const {
  real sum = 0;
  for (int64_t i = 0; i < size(); i++) {
    sum += data_[i] * data_[i];
  }
  return std::sqrt(sum);
}